

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O2

bool __thiscall anon_unknown.dwarf_38a::NinjaMain::OpenDepsLog(NinjaMain *this,bool recompact_only)

{
  DepsLog *this_00;
  bool bVar1;
  LoadStatus LVar2;
  bool bVar3;
  string err;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,".ninja_deps",(allocator<char> *)&local_80);
  if ((this->build_dir_)._M_string_length != 0) {
    std::operator+(&local_40,&this->build_dir_,"/");
    std::operator+(&local_80,&local_40,&local_60);
    std::__cxx11::string::operator=((string *)&local_60,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_40);
  }
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  this_00 = &this->deps_log_;
  LVar2 = DepsLog::Load(this_00,&local_60,&this->state_,&local_80);
  if (LVar2 == LOAD_ERROR) {
    bVar3 = false;
    Error("loading deps log %s: %s",local_60._M_dataplus._M_p,local_80._M_dataplus._M_p);
  }
  else {
    if (local_80._M_string_length != 0) {
      Warning("%s",local_80._M_dataplus._M_p);
      local_80._M_string_length = 0;
      *local_80._M_dataplus._M_p = '\0';
    }
    if (recompact_only) {
      bVar3 = true;
      if (LVar2 != LOAD_NOT_FOUND) {
        bVar1 = DepsLog::Recompact(this_00,&local_60,&local_80);
        if (!bVar1) {
          bVar3 = false;
          Error("failed recompaction: %s",local_80._M_dataplus._M_p);
        }
      }
    }
    else {
      bVar3 = true;
      if (this->config_->dry_run == false) {
        bVar1 = DepsLog::OpenForWrite(this_00,&local_60,&local_80);
        if (!bVar1) {
          bVar3 = false;
          Error("opening deps log: %s",local_80._M_dataplus._M_p);
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  return bVar3;
}

Assistant:

bool NinjaMain::OpenDepsLog(bool recompact_only) {
  string path = ".ninja_deps";
  if (!build_dir_.empty())
    path = build_dir_ + "/" + path;

  string err;
  const LoadStatus status = deps_log_.Load(path, &state_, &err);
  if (status == LOAD_ERROR) {
    Error("loading deps log %s: %s", path.c_str(), err.c_str());
    return false;
  }
  if (!err.empty()) {
    // Hack: Load() can return a warning via err by returning LOAD_SUCCESS.
    Warning("%s", err.c_str());
    err.clear();
  }

  if (recompact_only) {
    if (status == LOAD_NOT_FOUND) {
      return true;
    }
    bool success = deps_log_.Recompact(path, &err);
    if (!success)
      Error("failed recompaction: %s", err.c_str());
    return success;
  }

  if (!config_.dry_run) {
    if (!deps_log_.OpenForWrite(path, &err)) {
      Error("opening deps log: %s", err.c_str());
      return false;
    }
  }

  return true;
}